

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O3

void x86_cpu_reset(CPUState *dev)

{
  CPUX86State *env;
  uint uVar1;
  uint uVar2;
  TranslationBlock *pTVar3;
  long lVar4;
  uint32_t *puVar5;
  ulong uVar6;
  
  env = (CPUX86State *)(dev[1].tb_jmp_cache + 0xeb);
  (*(code *)dev[1].tb_jmp_cache[0x498])();
  memset(env,0,0x15a0);
  *(undefined4 *)(dev[1].tb_jmp_cache + 0x396) = 0xffffffff;
  *(undefined4 *)((long)dev[1].tb_jmp_cache + 0x80c) = 1;
  cpu_x86_update_cr0_x86_64(env,0x60000010);
  *(undefined4 *)(dev[1].tb_jmp_cache + 0x125) = 0xffffffff;
  *(undefined4 *)(dev[1].tb_jmp_cache + 0x37c) = 0x30000;
  dev[1].tb_jmp_cache[0x37d] = (TranslationBlock *)0x0;
  *(undefined4 *)(dev[1].tb_jmp_cache + 0x11f) = 0xffff;
  *(undefined4 *)(dev[1].tb_jmp_cache + 0x11c) = 0xffff;
  dev[1].tb_jmp_cache[0x116] = (TranslationBlock *)0x82000000ffff;
  dev[1].tb_jmp_cache[0x119] = (TranslationBlock *)0x8b000000ffff;
  *(undefined4 *)(dev[1].tb_jmp_cache + 0x105) = 0xf000;
  dev[1].tb_jmp_cache[0x106] = (TranslationBlock *)0xffff0000;
  dev[1].tb_jmp_cache[0x107] = (TranslationBlock *)0x9b000000ffff;
  uVar1 = *(uint *)((long)dev[1].tb_jmp_cache + 0x854);
  uVar2 = *(uint *)(dev[1].tb_jmp_cache + 0x101);
  *(undefined4 *)(dev[1].tb_jmp_cache + 0x10b) = 0;
  dev[1].tb_jmp_cache[0x10c] = (TranslationBlock *)0x0;
  dev[1].tb_jmp_cache[0x10d] = (TranslationBlock *)0x93000000ffff;
  *(undefined4 *)(dev[1].tb_jmp_cache + 0x102) = 0;
  dev[1].tb_jmp_cache[0x103] = (TranslationBlock *)0x0;
  dev[1].tb_jmp_cache[0x104] = (TranslationBlock *)0x93000000ffff;
  *(undefined4 *)(dev[1].tb_jmp_cache + 0x108) = 0;
  dev[1].tb_jmp_cache[0x109] = (TranslationBlock *)0x0;
  dev[1].tb_jmp_cache[0x10a] = (TranslationBlock *)0x93000000ffff;
  *(uint *)(dev[1].tb_jmp_cache + 0x101) = (uVar1 >> 0x11 & 0x20) + 0x40 + (uVar2 & 0xffff7f8c);
  cpu_sync_bndcs_hflags_x86_64(env);
  uVar1 = *(uint *)(dev[1].tb_jmp_cache + 0x101);
  uVar2 = *(uint *)((long)dev[1].tb_jmp_cache + 0x854) >> 0x11 & 0x20;
  *(undefined4 *)(dev[1].tb_jmp_cache + 0x10e) = 0;
  dev[1].tb_jmp_cache[0x10f] = (TranslationBlock *)0x0;
  dev[1].tb_jmp_cache[0x110] = (TranslationBlock *)0x93000000ffff;
  *(undefined4 *)(dev[1].tb_jmp_cache + 0x111) = 0;
  dev[1].tb_jmp_cache[0x112] = (TranslationBlock *)0x0;
  dev[1].tb_jmp_cache[0x113] = (TranslationBlock *)0x93000000ffff;
  if (-1 < (short)uVar1) {
    if (((((ulong)dev[1].tb_jmp_cache[0x120] & 1) == 0) || ((uVar1 & 0x10) == 0)) ||
       (((ulong)dev[1].tb_jmp_cache[0xfc] & 0x20000) != 0)) {
      uVar2 = uVar2 | 0x40;
    }
    else {
      uVar2 = uVar2 | (uint)((dev[1].tb_jmp_cache[0x103] != (TranslationBlock *)0x0 ||
                             dev[1].tb_jmp_cache[0x10c] != (TranslationBlock *)0x0) ||
                            dev[1].tb_jmp_cache[0x109] != (TranslationBlock *)0x0) << 6;
    }
  }
  *(uint *)(dev[1].tb_jmp_cache + 0x101) = uVar2 | uVar1 & 0xffffff9f;
  dev[1].tb_jmp_cache[0xfb] = (TranslationBlock *)0xfff0;
  dev[1].tb_jmp_cache[0xed] =
       (TranslationBlock *)(ulong)*(uint *)((long)dev[1].tb_jmp_cache + 0x1d34);
  dev[1].tb_jmp_cache[0xfc] = (TranslationBlock *)&DAT_00000002;
  *(undefined8 *)((long)dev[1].tb_jmp_cache + 0x99c) = 0x101010101010101;
  *(undefined2 *)((long)dev[1].tb_jmp_cache + 0x99a) = 0x37f;
  update_fp_status_x86_64(env);
  *(undefined4 *)(dev[1].tb_jmp_cache + 0x14d) = 0x1f80;
  dev[1].tb_jmp_cache[0x44c] = (TranslationBlock *)0x0;
  dev[1].tb_jmp_cache[0x37b] = (TranslationBlock *)0x7040600070406;
  dev[1].tb_jmp_cache[0x34e] =
       (TranslationBlock *)((ulong)((*(uint *)(dev[1].tb_jmp_cache + 0x3a8) & 8) << 0xf) + 1);
  dev[1].tb_jmp_cache[0x38a] = (TranslationBlock *)0x0;
  dev[1].tb_jmp_cache[0x38b] = (TranslationBlock *)0x0;
  dev[1].tb_jmp_cache[0x38c] = (TranslationBlock *)0x0;
  dev[1].tb_jmp_cache[0x38d] = (TranslationBlock *)0x0;
  dev[1].tb_jmp_cache[0x38e] = (TranslationBlock *)0x0;
  dev[1].tb_jmp_cache[0x38f] = (TranslationBlock *)0x0;
  dev[1].tb_jmp_cache[0x390] = (TranslationBlock *)0xffff0ff0;
  dev[1].tb_jmp_cache[0x391] = (TranslationBlock *)0x400;
  cpu_breakpoint_remove_all_x86_64(dev,0x20);
  cpu_watchpoint_remove_all_x86_64(dev,0x20);
  pTVar3 = (TranslationBlock *)((ulong)(*(byte *)((long)dev[1].tb_jmp_cache + 0x1d3b) & 2) + 1);
  lVar4 = 2;
  puVar5 = &x86_ext_save_areas[2].bits;
  do {
    uVar6 = 1L << ((byte)lVar4 & 0x3f);
    if ((*puVar5 &
        *(uint *)(dev[1].tb_jmp_cache + (ulong)((ExtSaveArea *)(puVar5 + -1))->feature + 0x3a7)) ==
        0) {
      uVar6 = 0;
    }
    pTVar3 = (TranslationBlock *)((ulong)pTVar3 | uVar6);
    lVar4 = lVar4 + 1;
    puVar5 = puVar5 + 4;
  } while (lVar4 != 10);
  uVar1 = *(uint *)(dev[1].tb_jmp_cache + 0x3a9);
  uVar2 = 0x40200;
  if ((*(uint *)(dev[1].tb_jmp_cache + 0x3a8) >> 0x1a & 1) == 0) {
    uVar2 = 0;
  }
  dev[1].tb_jmp_cache[0x34c] = pTVar3;
  cpu_x86_update_cr4_x86_64(env,uVar2 | (uVar1 & 1) << 0x10);
  memset(dev[1].tb_jmp_cache + 0x3fd,0,0xe0);
  return;
}

Assistant:

static void x86_cpu_reset(CPUState *dev)
{
    CPUState *s = CPU(dev);
    X86CPU *cpu = X86_CPU(s);
    X86CPUClass *xcc = X86_CPU_GET_CLASS(cpu);
    CPUX86State *env = &cpu->env;
    target_ulong cr4;
    uint64_t xcr0;
    int i;

    xcc->parent_reset(s);

    memset(env, 0, offsetof(CPUX86State, end_reset_fields));

    env->old_exception = -1;

    /* init to reset state */

    env->hflags2 |= HF2_GIF_MASK;

    cpu_x86_update_cr0(env, 0x60000010);
    env->a20_mask = ~0x0;
    env->smbase = 0x30000;
    env->msr_smi_count = 0;

    env->idt.limit = 0xffff;
    env->gdt.limit = 0xffff;
    env->ldt.limit = 0xffff;
    env->ldt.flags = DESC_P_MASK | (2 << DESC_TYPE_SHIFT);
    env->tr.limit = 0xffff;
    env->tr.flags = DESC_P_MASK | (11 << DESC_TYPE_SHIFT);

    cpu_x86_load_seg_cache(env, R_CS, 0xf000, 0xffff0000, 0xffff,
                           DESC_P_MASK | DESC_S_MASK | DESC_CS_MASK |
                           DESC_R_MASK | DESC_A_MASK);
    cpu_x86_load_seg_cache(env, R_DS, 0, 0, 0xffff,
                           DESC_P_MASK | DESC_S_MASK | DESC_W_MASK |
                           DESC_A_MASK);
    cpu_x86_load_seg_cache(env, R_ES, 0, 0, 0xffff,
                           DESC_P_MASK | DESC_S_MASK | DESC_W_MASK |
                           DESC_A_MASK);
    cpu_x86_load_seg_cache(env, R_SS, 0, 0, 0xffff,
                           DESC_P_MASK | DESC_S_MASK | DESC_W_MASK |
                           DESC_A_MASK);
    cpu_x86_load_seg_cache(env, R_FS, 0, 0, 0xffff,
                           DESC_P_MASK | DESC_S_MASK | DESC_W_MASK |
                           DESC_A_MASK);
    cpu_x86_load_seg_cache(env, R_GS, 0, 0, 0xffff,
                           DESC_P_MASK | DESC_S_MASK | DESC_W_MASK |
                           DESC_A_MASK);

    env->eip = 0xfff0;
    env->regs[R_EDX] = env->cpuid_version;

    env->eflags = 0x2;

    /* FPU init */
    for (i = 0; i < 8; i++) {
        env->fptags[i] = 1;
    }
    cpu_set_fpuc(env, 0x37f);

    env->mxcsr = 0x1f80;
    /* All units are in INIT state.  */
    env->xstate_bv = 0;

    env->pat = 0x0007040600070406ULL;
    env->msr_ia32_misc_enable = MSR_IA32_MISC_ENABLE_DEFAULT;
    if (env->features[FEAT_1_ECX] & CPUID_EXT_MONITOR) {
        env->msr_ia32_misc_enable |= MSR_IA32_MISC_ENABLE_MWAIT;
    }

    memset(env->dr, 0, sizeof(env->dr));
    env->dr[6] = DR6_FIXED_1;
    env->dr[7] = DR7_FIXED_1;
    cpu_breakpoint_remove_all(s, BP_CPU);
    cpu_watchpoint_remove_all(s, BP_CPU);

    cr4 = 0;
    xcr0 = XSTATE_FP_MASK;

    /* Enable all the features for user-mode.  */
    if (env->features[FEAT_1_EDX] & CPUID_SSE) {
        xcr0 |= XSTATE_SSE_MASK;
    }
    for (i = 2; i < ARRAY_SIZE(x86_ext_save_areas); i++) {
        const ExtSaveArea *esa = &x86_ext_save_areas[i];
        if (env->features[esa->feature] & esa->bits) {
            xcr0 |= 1ull << i;
        }
    }

    if (env->features[FEAT_1_ECX] & CPUID_EXT_XSAVE) {
        cr4 |= CR4_OSFXSR_MASK | CR4_OSXSAVE_MASK;
    }
    if (env->features[FEAT_7_0_EBX] & CPUID_7_0_EBX_FSGSBASE) {
        cr4 |= CR4_FSGSBASE_MASK;
    }

    env->xcr0 = xcr0;
    cpu_x86_update_cr4(env, cr4);

    /*
     * SDM 11.11.5 requires:
     *  - IA32_MTRR_DEF_TYPE MSR.E = 0
     *  - IA32_MTRR_PHYSMASKn.V = 0
     * All other bits are undefined.  For simplification, zero it all.
     */
    env->mtrr_deftype = 0;
    memset(env->mtrr_var, 0, sizeof(env->mtrr_var));
    memset(env->mtrr_fixed, 0, sizeof(env->mtrr_fixed));
}